

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O1

idx_t __thiscall duckdb::TaskScheduler::GetProducerCount(TaskScheduler *this)

{
  __pointer_type pPVar1;
  __pointer_type pPVar2;
  pointer pCVar3;
  idx_t iVar4;
  
  pCVar3 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>::
           operator->(&this->queue);
  pPVar1 = (pCVar3->q).producerListTail._M_b._M_p;
  iVar4 = 0;
  pPVar2 = pPVar1;
  while (pPVar2 != (__pointer_type)0x0) {
    iVar4 = iVar4 + 1;
    pPVar2 = (__pointer_type)(pPVar1->super_ConcurrentQueueProducerTypelessBase).next;
    pPVar1 = (__pointer_type)&pPVar2[-1].parent;
  }
  return iVar4;
}

Assistant:

idx_t TaskScheduler::GetProducerCount() const {
#ifndef DUCKDB_NO_THREADS
	return queue->q.size_producers_approx();
#else
	return queue->q.size();
#endif
}